

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.cc
# Opt level: O2

void __thiscall
CcTest::CcTest(CcTest *this,TestFunction *callback,char *test_file,char *test_name,
              char *test_dependency,bool test_is_enabled)

{
  char *pcVar1;
  char *pcVar2;
  CcTest *pCVar3;
  
  this->callback_ = callback;
  this->name_ = test_name;
  this->dependency_ = test_dependency;
  pCVar3 = last_;
  this->prev_ = last_;
  pcVar1 = strrchr(test_file,0x2f);
  if ((pcVar1 != (char *)0x0) || (pcVar1 = strrchr(test_file,0x5c), pcVar1 != (char *)0x0)) {
    test_file = pcVar1 + 1;
  }
  pcVar1 = strdup(test_file);
  pcVar2 = strrchr(pcVar1,0x2e);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
    pCVar3 = last_;
  }
  this->file_ = pcVar1;
  this->enabled_ = test_is_enabled;
  this->prev_ = pCVar3;
  last_ = this;
  return;
}

Assistant:

CcTest::CcTest(TestFunction* callback, const char* test_file,
               const char* test_name, const char* test_dependency,
               bool test_is_enabled)
    : callback_(callback), name_(test_name), dependency_(test_dependency),
      prev_(last_) {
  // Find the base name of this test (const_cast required on Windows).
  char *basename = strrchr(const_cast<char *>(test_file), '/');
  if (!basename) {
    basename = strrchr(const_cast<char *>(test_file), '\\');
  }
  if (!basename) {
    basename = strdup(test_file);
  } else {
    basename = strdup(basename + 1);
  }
  // Drop the extension, if there is one.
  char *extension = strrchr(basename, '.');
  if (extension) *extension = 0;
  // Install this test in the list of tests
  file_ = basename;
  enabled_ = test_is_enabled;
  prev_ = last_;
  last_ = this;
}